

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

int hts_itr_next(BGZF *fp,hts_itr_t *iter,void *r,void *data)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int end;
  int beg;
  int tid;
  int local_3c;
  int local_38;
  int local_34;
  
  iVar2 = -1;
  if ((iter != (hts_itr_t *)0x0) &&
     (iVar2 = -1, ((undefined1  [80])*iter & (undefined1  [80])0x2) == (undefined1  [80])0x0)) {
    if (((undefined1  [80])*iter & (undefined1  [80])0x1) == (undefined1  [80])0x0) {
      if (iter->off == (hts_pair64_t *)0x0) {
        return -1;
      }
      do {
        if ((iter->curr_off == 0) || (iter->off[iter->i].v <= iter->curr_off)) {
          uVar1 = iter->i;
          if (uVar1 == iter->n_off - 1U) {
            iVar3 = -1;
            goto LAB_00111858;
          }
          if (((int)uVar1 < 0) || (iter->off[uVar1].v != iter->off[(ulong)uVar1 + 1].u)) {
            bgzf_seek(fp,iter->off[(long)(int)uVar1 + 1].u,0);
            iter->curr_off = (ulong)(ushort)fp->block_offset | fp->block_address << 0x10;
          }
          iter->i = iter->i + 1;
        }
        iVar2 = (*iter->readrec)(fp,data,r,&local_34,&local_38,&local_3c);
        iVar3 = iVar2;
        if (iVar2 < 0) {
LAB_00111858:
          *(byte *)iter = *(byte *)iter | 2;
          return iVar3;
        }
        iter->curr_off = (ulong)(ushort)fp->block_offset | fp->block_address << 0x10;
        iVar3 = -1;
        if ((local_34 != iter->tid) || (iter->end <= local_38)) goto LAB_00111858;
      } while (local_3c <= iter->beg);
      iter->curr_tid = local_34;
      iter->curr_beg = local_38;
    }
    else {
      if (iter->curr_off != 0) {
        bgzf_seek(fp,iter->curr_off,0);
        iter->curr_off = 0;
      }
      iVar2 = (*iter->readrec)(fp,data,r,&local_34,&local_38,&local_3c);
      if (iVar2 < 0) {
        *(byte *)iter = *(byte *)iter | 2;
      }
      iter->curr_tid = local_34;
      iter->curr_beg = local_38;
    }
    iter->curr_end = local_3c;
  }
  return iVar2;
}

Assistant:

int hts_itr_next(BGZF *fp, hts_itr_t *iter, void *r, void *data)
{
    int ret, tid, beg, end;
    if (iter == NULL || iter->finished) return -1;
    if (iter->read_rest) {
        if (iter->curr_off) { // seek to the start
            bgzf_seek(fp, iter->curr_off, SEEK_SET);
            iter->curr_off = 0; // only seek once
        }
        ret = iter->readrec(fp, data, r, &tid, &beg, &end);
        if (ret < 0) iter->finished = 1;
        iter->curr_tid = tid;
        iter->curr_beg = beg;
        iter->curr_end = end;
        return ret;
    }
    if (iter->off == 0) return -1;
    for (;;) {
        if (iter->curr_off == 0 || iter->curr_off >= iter->off[iter->i].v) { // then jump to the next chunk
            if (iter->i == iter->n_off - 1) { ret = -1; break; } // no more chunks
            if (iter->i < 0 || iter->off[iter->i].v != iter->off[iter->i+1].u) { // not adjacent chunks; then seek
                bgzf_seek(fp, iter->off[iter->i+1].u, SEEK_SET);
                iter->curr_off = bgzf_tell(fp);
            }
            ++iter->i;
        }
        if ((ret = iter->readrec(fp, data, r, &tid, &beg, &end)) >= 0) {
            iter->curr_off = bgzf_tell(fp);
            if (tid != iter->tid || beg >= iter->end) { // no need to proceed
                ret = -1; break;
            } else if (end > iter->beg && iter->end > beg) {
                iter->curr_tid = tid;
                iter->curr_beg = beg;
                iter->curr_end = end;
                return ret;
            }
        } else break; // end of file or error
    }
    iter->finished = 1;
    return ret;
}